

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  BeagleCPUImpl<double,_1,_0> *pBVar10;
  long lVar11;
  pointer pdVar12;
  long lVar13;
  ulong uVar14;
  int k;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vector<double,_std::allocator<double>_> tmp;
  allocator_type local_91;
  long local_90;
  BeagleCPUImpl<double,_1,_0> *local_88;
  double *local_80;
  long local_78;
  double local_70;
  double *local_68;
  int *local_60;
  ulong local_58;
  value_type_conflict local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_90 = 0;
  local_88 = this;
  local_80 = preOrderPartial;
  local_70 = edgeLength;
  local_68 = outCrossProducts;
  local_60 = tipStates;
  for (lVar21 = 0; pBVar10 = local_88, lVar21 < local_88->kPatternCount; lVar21 = lVar21 + 1) {
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,
               (ulong)(uint)(local_88->kStateCount * local_88->kStateCount),&local_50,&local_91);
    uVar7 = pBVar10->kStateCount;
    uVar8 = pBVar10->kCategoryCount;
    lVar13 = (long)pBVar10->kPartialsPaddedStateCount;
    lVar17 = (long)local_60[lVar21];
    lVar11 = (long)pBVar10->kPatternCount;
    if (local_60[lVar21] < (int)uVar7) {
      auVar23 = ZEXT816(0);
      uVar14 = (ulong)(~((int)uVar7 >> 0x1f) & uVar7);
      pdVar18 = (double *)(local_90 * lVar13 + (long)local_80);
      for (uVar16 = 0; uVar16 != (~((int)uVar8 >> 0x1f) & uVar8); uVar16 = uVar16 + 1) {
        dVar2 = categoryRates[uVar16];
        dVar3 = categoryWeights[uVar16];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar3;
        pdVar12 = local_48._M_impl.super__Vector_impl_data._M_start + lVar17;
        uVar20 = 0;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = local_80[lVar17 + (uVar16 * lVar11 + lVar21) * lVar13];
        while (uVar14 != uVar20) {
          pdVar1 = pdVar18 + uVar20;
          uVar20 = uVar20 + 1;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *pdVar12;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_70 * dVar2;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = dVar3 * *pdVar1;
          auVar9 = vfmadd213sd_fma(auVar33,auVar29,auVar4);
          *pdVar12 = auVar9._0_8_;
          pdVar12 = pdVar12 + (int)uVar7;
        }
        auVar23 = vfmadd231sd_fma(auVar23,auVar31,auVar25);
        pdVar18 = pdVar18 + lVar11 * lVar13;
      }
      lVar17 = lVar17 << 3;
      auVar24._0_8_ = local_88->gPatternWeights[lVar21] / auVar23._0_8_;
      auVar24._8_8_ = 0;
      while (bVar22 = uVar14 != 0, uVar14 = uVar14 - 1, bVar22) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)((long)local_48._M_impl.super__Vector_impl_data._M_start + lVar17)
        ;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)((long)local_68 + lVar17);
        auVar23 = vfmadd213sd_fma(auVar27,auVar24,auVar6);
        *(long *)((long)local_68 + lVar17) = auVar23._0_8_;
        lVar17 = lVar17 + (long)(int)uVar7 * 8;
      }
    }
    else {
      lVar17 = (long)(int)uVar7;
      auVar23 = ZEXT816(0);
      local_58 = (ulong)(~((int)uVar8 >> 0x1f) & uVar8);
      uVar14 = (ulong)(~((int)uVar7 >> 0x1f) & uVar7);
      pdVar18 = (double *)(local_90 * lVar13 + (long)local_80);
      for (uVar16 = 0; uVar16 != local_58; uVar16 = uVar16 + 1) {
        dVar2 = categoryRates[uVar16];
        dVar3 = categoryWeights[uVar16];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar3;
        auVar30 = ZEXT864(0) << 0x40;
        for (uVar20 = 0; uVar14 != uVar20; uVar20 = uVar20 + 1) {
          auVar30 = ZEXT864((ulong)(auVar30._0_8_ + pdVar18[uVar20]));
        }
        lVar19 = 0;
        for (uVar20 = 0; uVar20 != uVar14; uVar20 = uVar20 + 1) {
          for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)((long)local_48._M_impl.super__Vector_impl_data._M_start +
                                     uVar15 * 8 + lVar19);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dVar2 * local_70;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = dVar3 * local_80[(uVar16 * lVar11 + lVar21) * lVar13 + uVar20];
            auVar9 = vfmadd213sd_fma(auVar34,auVar32,auVar5);
            *(long *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar15 * 8 + lVar19)
                 = auVar9._0_8_;
          }
          lVar19 = lVar19 + lVar17 * 8;
        }
        auVar23 = vfmadd231sd_fma(auVar23,auVar30._0_16_,auVar26);
        pdVar18 = pdVar18 + lVar11 * lVar13;
      }
      auVar23._0_8_ = local_88->gPatternWeights[lVar21] / auVar23._0_8_;
      auVar23._8_8_ = 0;
      pdVar12 = local_48._M_impl.super__Vector_impl_data._M_start;
      pdVar18 = local_68;
      for (uVar16 = 0; uVar16 != uVar14; uVar16 = uVar16 + 1) {
        for (uVar20 = 0; uVar7 != uVar20; uVar20 = uVar20 + 1) {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = pdVar12[uVar20];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdVar18[uVar20];
          auVar9 = vfmadd213sd_fma(auVar28,auVar23,auVar9);
          pdVar18[uVar20] = auVar9._0_8_;
        }
        pdVar12 = pdVar12 + lVar17;
        pdVar18 = pdVar18 + lVar17;
      }
    }
    local_78 = lVar21;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    local_90 = local_90 + 8;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}